

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply_property_conflict ply_find_property(p_ply_element_conflict element,char *name)

{
  p_ply_property_conflict ptVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int nproperties;
  int i;
  p_ply_property_conflict property;
  char *name_local;
  p_ply_element_conflict element_local;
  
  if ((element == (p_ply_element_conflict)0x0) || (name == (char *)0x0)) {
    __assert_fail("element && name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x3a9,"p_ply_property ply_find_property(p_ply_element, const char *)");
  }
  ptVar1 = element->property;
  iVar2 = (int)element->nproperties;
  if ((ptVar1 == (p_ply_property_conflict)0x0) && (iVar2 != 0)) {
    __assert_fail("property || nproperties == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x3ac,"p_ply_property ply_find_property(p_ply_element, const char *)");
  }
  if ((ptVar1 != (p_ply_property_conflict)0x0) && (iVar2 < 1)) {
    __assert_fail("!property || nproperties > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x3ad,"p_ply_property ply_find_property(p_ply_element, const char *)");
  }
  local_2c = 0;
  while( true ) {
    if (iVar2 <= local_2c) {
      return (p_ply_property_conflict)0x0;
    }
    iVar3 = strcmp(ptVar1[local_2c].name,name);
    if (iVar3 == 0) break;
    local_2c = local_2c + 1;
  }
  return ptVar1 + local_2c;
}

Assistant:

static p_ply_property ply_find_property(p_ply_element element,
        const char *name) {
    p_ply_property property;
    int i, nproperties;
    assert(element && name);
    property = element->property;
    nproperties = element->nproperties;
    assert(property || nproperties == 0);
    assert(!property || nproperties > 0);
    for (i = 0; i < nproperties; i++)
        if (!strcmp(property[i].name, name)) return &property[i];
    return NULL;
}